

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.cpp
# Opt level: O1

Vector3d * __thiscall
OpenMD::DipoleField::getValue(Vector3d *__return_storage_ptr__,DipoleField *this,StuntDouble *sd)

{
  double *pdVar1;
  AtomType *pAVar2;
  RealType RVar3;
  bool bVar4;
  uint i_1;
  uint i;
  long lVar5;
  _func_int *p_Var6;
  _func_int **pp_Var7;
  RigidBody *rb;
  undefined4 uVar8;
  undefined4 uVar9;
  double dVar10;
  Vector<double,_3U> result;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter fca;
  double local_98 [4];
  double local_78 [4];
  FluctuatingChargeAdapter local_58;
  FixedChargeAdapter local_50;
  double local_48 [3];
  
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] = 0.0;
  if (sd->objType_ == otRigidBody) {
    pp_Var7 = (_func_int **)sd[2].mass_;
    if (pp_Var7 == sd[2].properties_._vptr_PropertyMap) {
      p_Var6 = (_func_int *)0x0;
    }
    else {
      p_Var6 = *pp_Var7;
    }
    if (p_Var6 != (_func_int *)0x0) {
      do {
        pAVar2 = *(AtomType **)(p_Var6 + 0x78);
        local_50.at_ = pAVar2;
        bVar4 = FixedChargeAdapter::isFixedCharge(&local_50);
        uVar8 = 0;
        uVar9 = 0;
        if (bVar4) {
          RVar3 = FixedChargeAdapter::getCharge(&local_50);
          uVar8 = SUB84(RVar3,0);
          uVar9 = (undefined4)((ulong)RVar3 >> 0x20);
        }
        dVar10 = (double)CONCAT44(uVar9,uVar8);
        local_58.at_ = pAVar2;
        bVar4 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_58);
        if (bVar4) {
          dVar10 = dVar10 + *(double *)
                             (*(long *)(*(long *)(*(long *)(p_Var6 + 0x18) + 0x18) + 0x150 +
                                       *(long *)(p_Var6 + 0x10)) + (long)*(int *)(p_Var6 + 0x30) * 8
                             );
        }
        lVar5 = *(long *)(*(long *)(*(long *)(p_Var6 + 0x18) + 0x18) + *(long *)(p_Var6 + 0x10));
        local_78[2] = (double)*(undefined8 *)(lVar5 + 0x10 + (long)*(int *)(p_Var6 + 0x30) * 0x18);
        pdVar1 = (double *)(lVar5 + (long)*(int *)(p_Var6 + 0x30) * 0x18);
        local_78[0] = *pdVar1;
        local_78[1] = pdVar1[1];
        local_48[0] = 0.0;
        local_48[1] = 0.0;
        local_48[2] = 0.0;
        lVar5 = 0;
        do {
          local_48[lVar5] = local_78[lVar5] * dVar10;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        local_98[0] = 0.0;
        local_98[1] = 0.0;
        local_98[2] = 0.0;
        lVar5 = 0;
        do {
          local_98[lVar5] = local_48[lVar5] * 4.8032045444;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        lVar5 = 0;
        do {
          (__return_storage_ptr__->super_Vector<double,_3U>).data_[lVar5] =
               local_98[lVar5] + (__return_storage_ptr__->super_Vector<double,_3U>).data_[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        bVar4 = AtomType::isDipole(*(AtomType **)(p_Var6 + 0x78));
        if (bVar4) {
          lVar5 = *(long *)(*(long *)(*(long *)(p_Var6 + 0x18) + 0x18) + 0xf0 +
                           *(long *)(p_Var6 + 0x10));
          local_98[2] = (double)*(undefined8 *)(lVar5 + 0x10 + (long)*(int *)(p_Var6 + 0x30) * 0x18)
          ;
          pdVar1 = (double *)(lVar5 + (long)*(int *)(p_Var6 + 0x30) * 0x18);
          local_98[0] = *pdVar1;
          local_98[1] = pdVar1[1];
          lVar5 = 0;
          do {
            (__return_storage_ptr__->super_Vector<double,_3U>).data_[lVar5] =
                 local_98[lVar5] + (__return_storage_ptr__->super_Vector<double,_3U>).data_[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 != 3);
        }
        pp_Var7 = pp_Var7 + 1;
        if (pp_Var7 == sd[2].properties_._vptr_PropertyMap) {
          p_Var6 = (_func_int *)0x0;
        }
        else {
          p_Var6 = *pp_Var7;
        }
      } while (p_Var6 != (_func_int *)0x0);
    }
  }
  else if (sd->objType_ == otDAtom) {
    lVar5 = *(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).dipole.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + sd->storage_);
    local_78[2] = (double)*(undefined8 *)(lVar5 + 0x10 + (long)sd->localIndex_ * 0x18);
    pdVar1 = (double *)(lVar5 + (long)sd->localIndex_ * 0x18);
    local_78[0] = *pdVar1;
    local_78[1] = pdVar1[1];
    lVar5 = 0;
    do {
      (__return_storage_ptr__->super_Vector<double,_3U>).data_[lVar5] =
           local_78[lVar5] + (__return_storage_ptr__->super_Vector<double,_3U>).data_[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector3d DipoleField::getValue(StuntDouble* sd) {
    const RealType eAtoDebye = 4.8032045444;
    Vector3d dipoleVector(0.0);

    if (sd->isDirectionalAtom()) {
      dipoleVector += static_cast<DirectionalAtom*>(sd)->getDipole();
    }

    if (sd->isRigidBody()) {
      RigidBody* rb = static_cast<RigidBody*>(sd);
      Atom* atom;
      RigidBody::AtomIterator ai;
      for (atom = rb->beginAtom(ai); atom != NULL; atom = rb->nextAtom(ai)) {
        RealType charge(0.0);
        AtomType* atomType = atom->getAtomType();

        FixedChargeAdapter fca = FixedChargeAdapter(atomType);
        if (fca.isFixedCharge()) { charge = fca.getCharge(); }

        FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
        if (fqa.isFluctuatingCharge()) { charge += atom->getFlucQPos(); }

        Vector3d pos = atom->getPos();
        dipoleVector += pos * charge * eAtoDebye;

        if (atom->isDipole()) { dipoleVector += atom->getDipole(); }
      }
    }
    return dipoleVector;
  }